

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x1a0e8c8;
  *(undefined8 *)this = 0x1a0e990;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrix::TPZStructMatrix((TPZStructMatrix *)this,&PTR_construction_vtable_104__01a0ded0);
  *(undefined8 *)this = 0x1a0e2c0;
  *(undefined8 *)&this->field_0xb0 = 0x1a0e3a0;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__01a0def8);
  *(undefined8 *)this = 0x1a0dc90;
  *(undefined8 *)&this->field_0xb0 = 0x1a0de50;
  *(undefined8 *)&this->field_0xa0 = 0x1a0dd50;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}